

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_info_base.hpp
# Opt level: O2

void * asio::detail::thread_info_base::
       allocate<asio::detail::thread_info_base::executor_function_tag>
                 (long param_1,long param_2,ulong param_3)

{
  ulong uVar1;
  void *pointer;
  void *pvVar2;
  byte *pbVar3;
  long lVar4;
  byte bVar5;
  long lStack_20;
  
  uVar1 = param_2 + 3;
  if (param_1 != 0) {
    for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
      pbVar3 = *(byte **)(param_1 + 0x20 + lVar4 * 8);
      if (((pbVar3 != (byte *)0x0) && (uVar1 >> 2 <= (ulong)*pbVar3)) &&
         ((ulong)pbVar3 % param_3 == 0)) {
        *(undefined8 *)(param_1 + 0x20 + lVar4 * 8) = 0;
        bVar5 = *pbVar3;
        goto LAB_00158435;
      }
    }
    pvVar2 = *(void **)(param_1 + 0x20);
    if (pvVar2 == (void *)0x0) {
      pvVar2 = *(void **)(param_1 + 0x28);
      if (pvVar2 == (void *)0x0) goto LAB_00158416;
      lStack_20 = 5;
    }
    else {
      lStack_20 = 4;
    }
    *(undefined8 *)(param_1 + lStack_20 * 8) = 0;
    operator_delete(pvVar2);
  }
LAB_00158416:
  pbVar3 = (byte *)operator_new((uVar1 & 0xfffffffffffffffc) + 1);
  bVar5 = (byte)(uVar1 >> 2);
  if (0x3ff < uVar1) {
    bVar5 = 0;
  }
LAB_00158435:
  pbVar3[param_2] = bVar5;
  return pbVar3;
}

Assistant:

static void* allocate(Purpose, thread_info_base* this_thread,
      std::size_t size, std::size_t align = ASIO_DEFAULT_ALIGN)
  {
    std::size_t chunks = (size + chunk_size - 1) / chunk_size;

    if (this_thread)
    {
      for (int mem_index = Purpose::begin_mem_index;
          mem_index < Purpose::end_mem_index; ++mem_index)
      {
        if (this_thread->reusable_memory_[mem_index])
        {
          void* const pointer = this_thread->reusable_memory_[mem_index];
          unsigned char* const mem = static_cast<unsigned char*>(pointer);
          if (static_cast<std::size_t>(mem[0]) >= chunks
              && reinterpret_cast<std::size_t>(pointer) % align == 0)
          {
            this_thread->reusable_memory_[mem_index] = 0;
            mem[size] = mem[0];
            return pointer;
          }
        }
      }

      for (int mem_index = Purpose::begin_mem_index;
          mem_index < Purpose::end_mem_index; ++mem_index)
      {
        if (this_thread->reusable_memory_[mem_index])
        {
          void* const pointer = this_thread->reusable_memory_[mem_index];
          this_thread->reusable_memory_[mem_index] = 0;
          aligned_delete(pointer);
          break;
        }
      }
    }

    void* const pointer = aligned_new(align, chunks * chunk_size + 1);
    unsigned char* const mem = static_cast<unsigned char*>(pointer);
    mem[size] = (chunks <= UCHAR_MAX) ? static_cast<unsigned char>(chunks) : 0;
    return pointer;
  }